

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::Clone
          (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this,TPZGeoMesh *DestMesh)

{
  atomic_int *paVar1;
  TPZGeoMesh *pTVar2;
  TPZReference *pTVar3;
  TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this_00;
  
  pTVar2 = (this->super_TPZGeoElRefLess<pzgeom::TPZGeoPyramid>).super_TPZGeoEl.fMesh;
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)operator_new(0x260);
  if (pTVar2 == DestMesh) {
    *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoPyramid>).super_TPZGeoEl =
         &PTR__TPZSavable_018a8ff0;
    TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
              ((TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *)this_00,&PTR_PTR_018a52a8,
               &this->super_TPZGeoElRefLess<pzgeom::TPZGeoPyramid>);
    *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoPyramid>).super_TPZGeoEl =
         &PTR__TPZGeoElRefPattern_018a4fa8;
    TPZVec<long>::TPZVec(&this_00->fSubEl,&this->fSubEl);
    pTVar3 = (this->fRefPattern).fRef;
    (this_00->fRefPattern).fRef = pTVar3;
    LOCK();
    paVar1 = &pTVar3->fCounter;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  else {
    TPZGeoElRefPattern(this_00,DestMesh,this);
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::Clone(TPZGeoMesh &DestMesh) const{
    if(&DestMesh == this->Mesh())
    {
        return new TPZGeoElRefPattern<TGeo>(*this);
    }
    else
    {
        return new TPZGeoElRefPattern<TGeo>(DestMesh, *this);
    }
}